

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool anon_unknown.dwarf_675eac::ExpandMacros<cmCMakePresetsGraph::TestPreset>
               (cmCMakePresetsGraph *graph,TestPreset *preset,
               optional<cmCMakePresetsGraph::TestPreset> *out)

{
  _Base_ptr p_Var1;
  char cVar2;
  element_type *peVar3;
  pointer pbVar4;
  char cVar5;
  ExpandMacroResult EVar6;
  int iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  _Any_data *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *overwrite;
  pointer out_00;
  optional<bool> result;
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  macroExpanders;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  _Any_data local_b8;
  undefined8 local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  local_60;
  
  std::optional<cmCMakePresetsGraph::TestPreset>::emplace<cmCMakePresetsGraph::TestPreset_const&>
            (out,preset);
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var9 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
           super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = (_Base_ptr)
           ((long)&(out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                   _M_payload.
                   super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
                   super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload + 0xb0);
  local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var9 != p_Var1) {
    do {
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[](&local_60,(key_type *)(p_Var9 + 1));
      *pmVar8 = Unvisited;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != p_Var1);
  }
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = 0;
  local_68 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:354:5)>
             ::_M_manager;
  local_a0._8_8_ = 0;
  local_80._M_unused._M_object = graph;
  local_80._8_8_ = preset;
  local_a0._M_unused._M_object = operator_new(0x18);
  *(_Any_data **)local_a0._M_unused._0_8_ = &local_b8;
  *(optional<cmCMakePresetsGraph::TestPreset> **)((long)local_a0._M_unused._0_8_ + 8) = out;
  *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    **)((long)local_a0._M_unused._0_8_ + 0x10) = &local_60;
  local_88 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCMakePresetsGraph.cxx:413:5)>
             ::_M_manager;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&local_b8,(value_type *)&local_80);
  __x = &local_a0;
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::push_back((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
               *)&local_b8,(value_type *)__x);
  p_Var9 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
           super_Preset.Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var9 != p_Var1) {
    do {
      if ((char)p_Var9[3]._M_color == _S_black) {
        __x = (_Any_data *)(p_Var9 + 1);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 ::operator[](&local_60,(key_type *)__x);
        if (*pmVar8 != Verified) {
          if (*pmVar8 == InProgress) goto LAB_00224f01;
          iVar7 = ((preset->super_Preset).OriginFile)->Version;
          *pmVar8 = InProgress;
          __x = &local_b8;
          EVar6 = ExpandMacros((string *)(p_Var9 + 2),
                               (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                *)&local_b8,iVar7);
          if (EVar6 == Ok) {
            *pmVar8 = Verified;
          }
          else {
            if (EVar6 == Ignore) {
              cVar5 = '\x01';
              cVar2 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                      _M_payload.
                      super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
                      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged;
              goto joined_r0x00224f19;
            }
            if (EVar6 == Error) goto LAB_00224f01;
          }
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != p_Var1);
  }
  peVar3 = (preset->super_Preset).ConditionEvaluator.
           super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    out_00 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
             super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
             OverwriteConfigurationFile.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
             super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload._M_value.
             OverwriteConfigurationFile.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (out_00 != pbVar4) {
      do {
        __x = &local_b8;
        EVar6 = ExpandMacros(out_00,(vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                     *)&local_b8,((preset->super_Preset).OriginFile)->Version);
        if (EVar6 == Error) goto LAB_00224f01;
        if (EVar6 == Ignore) goto LAB_00224eef;
        out_00 = out_00 + 1;
      } while (out_00 != pbVar4);
    }
    if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x1b8] ==
        '\x01') {
      __x = &local_b8;
      EVar6 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Output.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                            ._M_payload._M_value.OutputLogFile,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) {
LAB_00224f01:
        cVar5 = '\0';
        goto LAB_00224f27;
      }
      if (EVar6 != Ignore) {
        __x = &local_b8;
        EVar6 = ExpandMacros(&(out->
                              super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                              _M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                              .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                              _M_payload._M_value.Output.
                              super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                              ._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                              .
                              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                              ._M_payload._M_value.OutputJUnitFile,
                             (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                              *)__x,((preset->super_Preset).OriginFile)->Version);
        if (EVar6 == Error) goto LAB_00224f01;
        if (EVar6 != Ignore) goto LAB_00224d19;
      }
LAB_00224eef:
      cVar2 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged;
    }
    else {
LAB_00224d19:
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x318] !=
          '\x01') goto LAB_00224ec3;
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x260] !=
          '\x01') goto LAB_00224dbd;
      __x = &local_b8;
      EVar6 = ExpandMacros((string *)
                           &(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_00224f01;
      if (EVar6 == Ignore) goto LAB_00224eef;
      __x = &local_b8;
      EVar6 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Include.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions>
                            ._M_payload._M_value.Label,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_00224f01;
      if (EVar6 == Ignore) goto LAB_00224eef;
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x250] ==
          '\x01') {
        __x = &local_b8;
        EVar6 = ExpandMacros(&(out->
                              super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                              _M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                              .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                              _M_payload._M_value.Filter.
                              super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                              ._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                              .
                              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                              ._M_payload._M_value.Include.
                              super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions,_false,_false>
                              ._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions,_true,_false,_false>
                              .
                              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions>
                              ._M_payload._M_value.Index.
                              super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
                              ._M_payload.
                              super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
                              .
                              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                              ._M_payload._M_value.IndexFile,
                             (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                              *)__x,((preset->super_Preset).OriginFile)->Version);
        if (EVar6 == Error) goto LAB_00224f01;
        if (EVar6 == Ignore) goto LAB_00224eef;
      }
LAB_00224dbd:
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x310] !=
          '\x01') {
LAB_00224ec3:
        if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x380]
            == '\x01') {
          __x = &local_b8;
          EVar6 = ExpandMacros(&(out->
                                super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)
                                ._M_payload.
                                super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                                .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                                _M_payload._M_value.Execution.
                                super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                                ._M_payload.
                                super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                                .
                                super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                                ._M_payload._M_value.ResourceSpecFile,
                               (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                                *)__x,((preset->super_Preset).OriginFile)->Version);
          if (EVar6 == Error) goto LAB_00224f01;
          if (EVar6 == Ignore) goto LAB_00224eef;
        }
        cVar5 = '\x01';
        goto LAB_00224f27;
      }
      __x = &local_b8;
      EVar6 = ExpandMacros((string *)
                           &(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Exclude,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_00224f01;
      if (EVar6 == Ignore) goto LAB_00224eef;
      __x = &local_b8;
      EVar6 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Exclude.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                            ._M_payload._M_value.Label,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_00224f01;
      if (EVar6 == Ignore) goto LAB_00224eef;
      if ((out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_payload.field2[0x308] !=
          '\x01') goto LAB_00224ec3;
      __x = &local_b8;
      EVar6 = ExpandMacros((string *)
                           &(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Exclude.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                            ._M_payload._M_value.Fixtures,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_00224f01;
      if (EVar6 == Ignore) goto LAB_00224eef;
      __x = &local_b8;
      EVar6 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Exclude.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                            ._M_payload._M_value.Fixtures.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                            ._M_payload._M_value.Setup,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_00224f01;
      if (EVar6 == Ignore) goto LAB_00224eef;
      __x = &local_b8;
      EVar6 = ExpandMacros(&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>
                            .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>.
                            _M_payload._M_value.Filter.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                            ._M_payload._M_value.Exclude.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
                            ._M_payload._M_value.Fixtures.
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_false,_false>
                            ._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                            ._M_payload._M_value.Cleanup,
                           (vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
                            *)__x,((preset->super_Preset).OriginFile)->Version);
      if (EVar6 == Error) goto LAB_00224f01;
      if (EVar6 != Ignore) goto LAB_00224ec3;
      cVar2 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
              super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged;
    }
    cVar5 = '\x01';
  }
  else {
    __x = &local_b8;
    iVar7 = (*peVar3->_vptr_Condition[2])
                      (peVar3,__x,(ulong)(uint)((preset->super_Preset).OriginFile)->Version);
    cVar5 = (char)iVar7;
    if (cVar5 == '\0') goto LAB_00224f27;
    cVar2 = (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
            super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged;
  }
joined_r0x00224f19:
  if (cVar2 == '\x01') {
    (out->super__Optional_base<cmCMakePresetsGraph::TestPreset,_false,_false>)._M_payload.
    super__Optional_payload<cmCMakePresetsGraph::TestPreset,_true,_false,_false>.
    super__Optional_payload_base<cmCMakePresetsGraph::TestPreset>._M_engaged = false;
    cmCMakePresetsGraph::TestPreset::~TestPreset((TestPreset *)out);
  }
LAB_00224f27:
  if (local_90 != (code *)0x0) {
    __x = &local_a0;
    (*local_90)(__x,__x,3);
  }
  if (local_70 != (code *)0x0) {
    __x = &local_80;
    (*local_70)(__x,__x,3);
  }
  std::
  vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
  ::~vector((vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
             *)&local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)__x);
  return (bool)cVar5;
}

Assistant:

bool ExpandMacros(const cmCMakePresetsGraph& graph, const T& preset,
                  cm::optional<T>& out)
{
  out.emplace(preset);

  std::map<std::string, CycleStatus> envCycles;
  for (auto const& v : out->Environment) {
    envCycles[v.first] = CycleStatus::Unvisited;
  }

  std::vector<MacroExpander> macroExpanders;

  MacroExpander defaultMacroExpander =
    [&graph, &preset](const std::string& macroNamespace,
                      const std::string& macroName, std::string& macroOut,
                      int version) -> ExpandMacroResult {
    if (macroNamespace.empty()) {
      if (macroName == "sourceDir") {
        macroOut += graph.SourceDir;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceParentDir") {
        macroOut += cmSystemTools::GetParentDirectory(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "sourceDirName") {
        macroOut += cmSystemTools::GetFilenameName(graph.SourceDir);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "presetName") {
        macroOut += preset.Name;
        return ExpandMacroResult::Ok;
      }
      if (macroName == "generator") {
        // Generator only makes sense if preset is not hidden.
        if (!preset.Hidden) {
          macroOut += graph.GetGeneratorForPreset(preset.Name);
        }
        return ExpandMacroResult::Ok;
      }
      if (macroName == "dollar") {
        macroOut += '$';
        return ExpandMacroResult::Ok;
      }
      if (macroName == "hostSystemName") {
        if (version < 3) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemName();
        return ExpandMacroResult::Ok;
      }
      if (macroName == "fileDir") {
        if (version < 4) {
          return ExpandMacroResult::Error;
        }
        macroOut +=
          cmSystemTools::GetParentDirectory(preset.OriginFile->Filename);
        return ExpandMacroResult::Ok;
      }
      if (macroName == "pathListSep") {
        if (version < 5) {
          return ExpandMacroResult::Error;
        }
        macroOut += cmSystemTools::GetSystemPathlistSeparator();
        return ExpandMacroResult::Ok;
      }
    }

    return ExpandMacroResult::Ignore;
  };

  MacroExpander environmentMacroExpander =
    [&macroExpanders, &out, &envCycles](
      const std::string& macroNamespace, const std::string& macroName,
      std::string& result, int version) -> ExpandMacroResult {
    if (macroNamespace == "env" && !macroName.empty() && out) {
      auto v = out->Environment.find(macroName);
      if (v != out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, envCycles[macroName], macroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        result += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      const char* value = std::getenv(macroName.c_str());
      if (value) {
        result += value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  };

  macroExpanders.push_back(defaultMacroExpander);
  macroExpanders.push_back(environmentMacroExpander);

  for (auto& v : out->Environment) {
    if (v.second) {
      switch (VisitEnv(*v.second, envCycles[v.first], macroExpanders,
                       graph.GetVersion(preset))) {
        case ExpandMacroResult::Error:
          return false;
        case ExpandMacroResult::Ignore:
          out.reset();
          return true;
        case ExpandMacroResult::Ok:
          break;
      }
    }
  }

  if (preset.ConditionEvaluator) {
    cm::optional<bool> result;
    if (!preset.ConditionEvaluator->Evaluate(
          macroExpanders, graph.GetVersion(preset), result)) {
      return false;
    }
    if (!result) {
      out.reset();
      return true;
    }
    out->ConditionResult = *result;
  }

  return ExpandMacros(graph, preset, out, macroExpanders);
}